

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

ArgException * __thiscall TCLAP::ArgException::argId_abi_cxx11_(ArgException *this)

{
  bool bVar1;
  long in_RSI;
  allocator local_19 [9];
  ArgException *this_local;
  
  this_local = this;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (in_RSI + 0x28),"undefined");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this," ",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Argument: "
                  );
  }
  return this;
}

Assistant:

std::string argId() const  
		{ 
			if ( _argId == "undefined" )
				return " ";
			else
				return ( "Argument: " + _argId ); 
		}